

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O1

int64_t hdr_interval_recorder_record_values(hdr_interval_recorder *r,int64_t value,int64_t count)

{
  _Bool _Var1;
  int64_t critical_value_at_enter;
  
  critical_value_at_enter = hdr_phaser_writer_enter(&r->phaser);
  _Var1 = hdr_record_values(r->active,value,count);
  hdr_phaser_writer_exit(&r->phaser,critical_value_at_enter);
  return (ulong)_Var1;
}

Assistant:

int64_t hdr_interval_recorder_record_values(
    struct hdr_interval_recorder* r,
    int64_t value,
    int64_t count
)
{
    int64_t params[3];
    params[0] = value;
    params[1] = count;
    params[2] = 0;

    hdr_interval_recorder_update(r, update_values, &params[0]);
    return params[2];
}